

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void __thiscall Graphics::Graphics(Graphics *this)

{
  GameTitle *pGVar1;
  GameTitle *local_28;
  
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Screen::Screen(&this->screen);
  pGVar1 = (GameTitle *)operator_new(0x108);
  GameTitle::GameTitle(pGVar1);
  local_28 = pGVar1;
  std::vector<Animation*,std::allocator<Animation*>>::emplace_back<Animation*>
            ((vector<Animation*,std::allocator<Animation*>> *)this,(Animation **)&local_28);
  pGVar1 = (GameTitle *)operator_new(0x48);
  (pGVar1->super_Animation).description._M_string_length = 0;
  (pGVar1->super_Animation).description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pGVar1->super_Animation).name.field_2 + 8) = 0;
  (pGVar1->super_Animation).description._M_dataplus._M_p = (pointer)0x0;
  (pGVar1->super_Animation).name._M_string_length = 0;
  (pGVar1->super_Animation).name.field_2._M_allocated_capacity = 0;
  (pGVar1->super_Animation)._vptr_Animation = (_func_int **)0x0;
  (pGVar1->super_Animation).name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&(pGVar1->super_Animation).description.field_2 + 8) = 0;
  Fireworks::Fireworks((Fireworks *)pGVar1);
  local_28 = pGVar1;
  std::vector<Animation*,std::allocator<Animation*>>::emplace_back<Animation*>
            ((vector<Animation*,std::allocator<Animation*>> *)this,(Animation **)&local_28);
  return;
}

Assistant:

Graphics::Graphics(){
    // Create the animations array
    animations.push_back(new GameTitle());
    animations.push_back(new Fireworks());

    // TODO: Create the menus
}